

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O2

void __thiscall discordpp::TeamMember::TeamMember(TeamMember *this,TeamMember *param_1)

{
  field<int>::field(&this->membership_state,&param_1->membership_state);
  field<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::field(&this->permissions,&param_1->permissions);
  field<discordpp::Snowflake>::field(&this->team_id,&param_1->team_id);
  field<discordpp::User>::field(&this->user,&param_1->user);
  return;
}

Assistant:

TeamMember(
        field<int> membership_state = uninitialized,
        field<std::vector<std::string> > permissions = uninitialized,
        field<Snowflake> team_id = uninitialized,
        field<User> user = uninitialized
    ):
        membership_state(membership_state),
        permissions(permissions),
        team_id(team_id),
        user(user)
    {}